

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::shadeFragments
          (TextureCubeArrayShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  deUint32 dVar2;
  pointer pUVar3;
  TextureCubeArray *this_00;
  GenericVec4 *pGVar4;
  TextureCubeArrayShader *pTVar5;
  int i;
  int iVar6;
  int iVar7;
  long lVar8;
  int fragNdx;
  long lVar9;
  FragmentPacket *packet;
  int fragNdx_1;
  float *pfVar10;
  Vec4 *output;
  Vec4 coord;
  IVec4 icolor;
  UVec4 uicolor;
  Vec4 texBias;
  Vec4 texScale;
  Vec4 texCoords [4];
  Vec4 colors [4];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  deUint32 dStack_114;
  undefined8 uStack_110;
  ulong local_108;
  deUint32 local_100;
  deUint32 local_fc;
  deUint32 local_f8;
  deUint32 local_f4;
  ulong local_f0;
  TextureCubeArrayShader *local_e8;
  FragmentPacket *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Vec4 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pUVar3 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c8 = *(undefined8 *)&pUVar3[2].value;
  uStack_c0 = *(undefined8 *)((long)&pUVar3[2].value + 8);
  local_d8 = *(undefined8 *)&pUVar3[3].value;
  uStack_d0 = *(undefined8 *)((long)&pUVar3[3].value + 8);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[3] = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  if (0 < numPackets) {
    local_f0 = (ulong)(uint)numPackets;
    local_108 = 0;
    local_e8 = this;
    local_e0 = packets;
    do {
      pTVar5 = local_e8;
      this_00 = (local_e8->super_ShaderProgram).m_uniforms.
                super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                super__Vector_impl_data._M_start[1].sampler.texCubeArray;
      packet = local_e0 + local_108;
      pfVar10 = local_b8.m_data + 3;
      lVar9 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_128,packet,context,0,(int)lVar9);
        iVar6 = pTVar5->m_layer;
        *(undefined8 *)((Vec4 *)(pfVar10 + -3))->m_data = local_128;
        pfVar10[-1] = (float)uStack_120;
        *pfVar10 = (float)iVar6;
        lVar9 = lVar9 + 1;
        pfVar10 = pfVar10 + 4;
      } while (lVar9 != 4);
      output = &local_78;
      sglr::rc::TextureCubeArray::sample4(this_00,output,&local_b8,0.0);
      DVar1 = pTVar5->m_outputType;
      pGVar4 = context->outputArray;
      iVar6 = (int)local_108 * 4;
      lVar9 = 0;
      do {
        _local_118 = 0;
        uStack_110 = 0;
        lVar8 = 0;
        do {
          (&local_118)[lVar8] = output->m_data[lVar8] * *(float *)((long)&local_c8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_128 = 0;
        uStack_120 = 0;
        lVar8 = 0;
        do {
          *(float *)((long)&local_128 + lVar8 * 4) =
               (&local_118)[lVar8] + *(float *)((long)&local_d8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        castVectorSaturate<int>((Vec4 *)&local_128);
        castVectorSaturate<unsigned_int>((Vec4 *)&local_128);
        iVar7 = (int)lVar9;
        if (DVar1 == TYPE_UINT_VEC4) {
          lVar8 = (long)((iVar6 + iVar7) * context->numFragmentOutputs);
          pGVar4[lVar8].v.uData[0] = local_100;
          pGVar4[lVar8].v.uData[1] = local_fc;
          pGVar4[lVar8].v.uData[2] = local_f8;
          dVar2 = local_f4;
LAB_0150843d:
          pGVar4[lVar8].v.uData[3] = dVar2;
        }
        else {
          if (DVar1 == TYPE_INT_VEC4) {
            lVar8 = (long)((iVar6 + iVar7) * context->numFragmentOutputs);
            pGVar4[lVar8].v.uData[0] = (deUint32)local_118;
            pGVar4[lVar8].v.uData[1] = dStack_114;
            pGVar4[lVar8].v.uData[2] = (deUint32)uStack_110;
            dVar2 = uStack_110._4_4_;
            goto LAB_0150843d;
          }
          if (DVar1 == TYPE_FLOAT_VEC4) {
            iVar7 = (iVar6 + iVar7) * context->numFragmentOutputs;
            pGVar4[iVar7].v.uData[0] = (deUint32)local_128;
            pGVar4[iVar7].v.uData[1] = local_128._4_4_;
            pGVar4[iVar7].v.uData[2] = (deUint32)(float)uStack_120;
            pGVar4[iVar7].v.uData[3] = uStack_120._4_4_;
          }
        }
        lVar9 = lVar9 + 1;
        output = output + 1;
      } while (lVar9 != 4);
      local_108 = local_108 + 1;
    } while (local_108 != local_f0);
  }
  return;
}

Assistant:

void TextureCubeArrayShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale (m_uniforms[2].value.f4);
	const tcu::Vec4 texBias	 (m_uniforms[3].value.f4);

	tcu::Vec4 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::TextureCubeArray* tex = m_uniforms[1].sampler.texCubeArray;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec4(coord.x(), coord.y(), coord.z(), (float)m_layer);
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)	rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)	rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}